

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coincontrol.cpp
# Opt level: O2

bool __thiscall wallet::CCoinControl::IsExternalSelected(CCoinControl *this,COutPoint *outpoint)

{
  long lVar1;
  undefined1 uVar2;
  const_iterator cVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  cVar3 = std::
          _Rb_tree<COutPoint,_std::pair<const_COutPoint,_wallet::PreselectedInput>,_std::_Select1st<std::pair<const_COutPoint,_wallet::PreselectedInput>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_wallet::PreselectedInput>_>_>
          ::find(&(this->m_selected)._M_t,outpoint);
  if ((_Rb_tree_header *)cVar3._M_node == &(this->m_selected)._M_t._M_impl.super__Rb_tree_header) {
    uVar2 = 0;
  }
  else {
    uVar2 = *(undefined1 *)&cVar3._M_node[3]._M_left;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)uVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool CCoinControl::IsExternalSelected(const COutPoint& outpoint) const
{
    const auto it = m_selected.find(outpoint);
    return it != m_selected.end() && it->second.HasTxOut();
}